

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound_linux_alsa.cpp
# Opt level: O3

YSRESULT __thiscall YsSoundPlayer::APISpecificData::End(APISpecificData *this)

{
  if (this->hwParam != (snd_pcm_hw_params_t *)0x0) {
    this->hwParam = (snd_pcm_hw_params_t *)0x0;
  }
  if (this->swParam != (snd_pcm_sw_params_t *)0x0) {
    this->swParam = (snd_pcm_sw_params_t *)0x0;
  }
  if (this->handle != (snd_pcm_t *)0x0) {
    snd_pcm_close();
    this->handle = (snd_pcm_t *)0x0;
  }
  if (this->writeBuf != (uchar *)0x0) {
    operator_delete__(this->writeBuf);
    this->writeBuf = (uchar *)0x0;
  }
  return YSOK;
}

Assistant:

YSRESULT YsSoundPlayer::APISpecificData::End(void)
{
	if(nullptr!=hwParam)
	{
		// This gives an error => snd_pcm_hw_params_free(hwParam);
		hwParam=nullptr;
	}
	if(nullptr!=swParam)
	{
		// This gives an error => snd_pcm_sw_params_free(swParam);
		swParam=nullptr;
	}
	if(nullptr!=handle)
	{
		snd_pcm_close(handle);
		handle=nullptr;
	}
	if(nullptr!=writeBuf)
	{
		delete [] writeBuf;
		writeBuf=nullptr;
	}

	CleanUp();

	return YSOK;
}